

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O2

time_t mkgmtime(tm *ptm)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  iVar5 = ptm->tm_year + 0x76c;
  uVar6 = 0x7b2;
  iVar4 = -0x7b2;
  lVar2 = 0;
  while( true ) {
    if (iVar5 <= (int)uVar6) break;
    lVar3 = 0x1e13380;
    if ((uVar6 & 3) == 0) {
      lVar7 = 0x1e28500;
      if ((uVar6 / 400) * 400 + iVar4 != 0) {
        lVar7 = 0x1e13380;
      }
      lVar3 = 0x1e28500;
      if ((uVar6 / 100) * 100 + iVar4 == 0) {
        lVar3 = lVar7;
      }
    }
    lVar2 = lVar2 + lVar3;
    uVar6 = uVar6 + 1;
    iVar4 = iVar4 + -1;
  }
  uVar1 = 0;
  uVar8 = (ulong)(uint)ptm->tm_mon;
  if (ptm->tm_mon < 1) {
    uVar8 = uVar1;
  }
  for (; uVar8 * 4 != uVar1; uVar1 = uVar1 + 4) {
    lVar2 = lVar2 + (long)*(int *)((long)mkgmtime::DaysOfMonth + uVar1) * 0x15180;
    lVar3 = lVar2;
    if (iVar5 % 400 == 0) {
      lVar3 = lVar2 + 0x15180;
    }
    if (iVar5 % 100 != 0) {
      lVar3 = lVar2 + 0x15180;
    }
    if (uVar1 != 4) {
      lVar3 = lVar2;
    }
    if ((ptm->tm_year & 3U) == 0) {
      lVar2 = lVar3;
    }
  }
  iVar4 = ptm->tm_mday * 0x15180 + -0x15180;
  if (ptm->tm_mday == 0) {
    iVar4 = 0;
  }
  return lVar2 + (long)ptm->tm_hour * 0xe10 + (long)ptm->tm_min * 0x3c + (long)ptm->tm_sec +
         (long)iVar4;
}

Assistant:

inline std::time_t mkgmtime(const struct std::tm* ptm)
{
    static constexpr auto SecondsPerMinute = 60;
    static constexpr auto SecondsPerHour = 3600;
    static constexpr auto SecondsPerDay = 86400;

    static constexpr int DaysOfMonth[12] = {
        31, 28, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
    };

    auto isLeapYear = [](int year)
    {
        if (year % 4 != 0)
            return false;
        if (year % 100 != 0)
            return true;

        return (year % 400) == 0;
    };

    std::time_t secs = 0;
    int year = ptm->tm_year + 1900;
    for (int y = 1970; y < year; ++y)
        secs += (isLeapYear(y) ? 366 : 365) * SecondsPerDay;
    for (int m = 0; m < ptm->tm_mon; ++m)
    {
        secs += DaysOfMonth[m] * SecondsPerDay;
        if (m == 1 && isLeapYear(year))
            secs += SecondsPerDay;
    }

    // ptm may reprensent a time only
    if (ptm->tm_mday)
        secs += (ptm->tm_mday - 1) * SecondsPerDay;
    secs += ptm->tm_hour       * SecondsPerHour;
    secs += ptm->tm_min        * SecondsPerMinute;
    secs += ptm->tm_sec;
    return secs;
}